

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O2

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::NodeImpl::handleNotifyNetworkActiveChanged
          (NodeImpl *this,NotifyNetworkActiveChangedFn fn)

{
  function<void_(bool)> *in_RDX;
  long in_FS_OFFSET;
  connection cVar1;
  function<void_(bool)> in_stack_ffffffffffffffb8;
  CClientUIInterface local_28 [8];
  weak_count local_20;
  weak_count local_18;
  
  local_18.pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  std::function<void_(bool)>::function((function<void_(bool)> *)&stack0xffffffffffffffb8,in_RDX);
  cVar1 = CClientUIInterface::NotifyNetworkActiveChanged_connect(local_28,in_stack_ffffffffffffffb8)
  ;
  cVar1._weak_connection_body.px = (element_type *)local_28;
  interfaces::MakeSignalHandler((interfaces *)this,cVar1);
  boost::detail::weak_count::~weak_count(&local_20);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffffb8);
  if (*(sp_counted_base **)(in_FS_OFFSET + 0x28) == local_18.pi_) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleNotifyNetworkActiveChanged(NotifyNetworkActiveChangedFn fn) override
    {
        return MakeSignalHandler(::uiInterface.NotifyNetworkActiveChanged_connect(fn));
    }